

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_interpolation_qualifiers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Bitset *flags)

{
  bool bVar1;
  uint uVar2;
  const_iterator cVar3;
  runtime_error *prVar4;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (uint)flags->lower;
  if ((uVar2 >> 0xe & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((short)uVar2 < 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x12 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  local_50._M_dataplus._M_p._0_4_ = 0x1497;
  this_00 = &flags->higher;
  cVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_50);
  if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  local_50._M_dataplus._M_p._0_4_ = 4999;
  cVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_50);
  if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GL_AMD_shader_explicit_vertex_parameter","");
    require_extension_internal(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  local_50._M_dataplus._M_p._0_4_ = 0x14a5;
  cVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_50);
  if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    bVar1 = (this->options).es;
    uVar2 = (this->options).version;
    if ((uVar2 < 0x140 & bVar1) == 1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"pervertexEXT requires ESSL 320.","");
      ::std::runtime_error::runtime_error(prVar4,(string *)&local_50);
      *(undefined ***)prVar4 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar1 == false && uVar2 < 0x1c2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"pervertexEXT requires GLSL 450.","");
      ::std::runtime_error::runtime_error(prVar4,(string *)&local_50);
      *(undefined ***)prVar4 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (this->barycentric_is_nv == true) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"GL_NV_fragment_shader_barycentric","");
      require_extension_internal(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"GL_EXT_fragment_shader_barycentric","");
      require_extension_internal(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "smooth ";
	if (flags.get(DecorationFlat))
		res += "flat ";
	if (flags.get(DecorationNoPerspective))
		res += "noperspective ";
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch ";
	if (flags.get(DecorationSample))
		res += "sample ";
	if (flags.get(DecorationInvariant))
		res += "invariant ";
	if (flags.get(DecorationPerPrimitiveEXT))
	    res += "perprimitiveEXT ";

	if (flags.get(DecorationExplicitInterpAMD))
	{
		require_extension_internal("GL_AMD_shader_explicit_vertex_parameter");
		res += "__explicitInterpAMD ";
	}

	if (flags.get(DecorationPerVertexKHR))
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("pervertexEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("pervertexEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			res += "pervertexNV ";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			res += "pervertexEXT ";
		}
	}

	return res;
}